

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  string_t element;
  string_t element_00;
  string_t element_01;
  string_t element_02;
  UnifiedVectorFormat idata;
  long *local_78;
  long local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if (*input == (Vector)0x0) {
    lVar3 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar8 = 0;
      uVar6 = 0;
      do {
        if (*(long *)(input + 0x28) == 0) {
          uVar7 = uVar6 + 0x40;
          if (count <= uVar6 + 0x40) {
            uVar7 = count;
          }
LAB_0050059a:
          uVar4 = uVar6;
          if (uVar6 < uVar7) {
            puVar5 = (undefined8 *)(uVar6 * 0x10 + lVar3 + 8);
            do {
              element_00.value.pointer.ptr = (char *)*puVar5;
              element_00.value._0_8_ = puVar5[-1];
              QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                        ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                         element_00,aggr_input_data);
              uVar6 = uVar6 + 1;
              puVar5 = puVar5 + 2;
              uVar4 = uVar7;
            } while (uVar7 != uVar6);
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)(input + 0x28) + uVar8 * 8);
          uVar7 = uVar6 + 0x40;
          if (count <= uVar6 + 0x40) {
            uVar7 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto LAB_0050059a;
          uVar4 = uVar7;
          if ((uVar2 != 0) && (uVar4 = uVar6, uVar6 < uVar7)) {
            puVar5 = (undefined8 *)(uVar6 * 0x10 + lVar3 + 8);
            uVar9 = 0;
            do {
              if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
                element.value.pointer.ptr = (char *)*puVar5;
                element.value._0_8_ = puVar5[-1];
                QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                          ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                           element,aggr_input_data);
              }
              uVar9 = uVar9 + 1;
              puVar5 = puVar5 + 2;
              uVar4 = uVar7;
            } while (uVar7 - uVar6 != uVar9);
          }
        }
        uVar6 = uVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      paVar1 = *(anon_union_16_2_67f50693_for_value **)(input + 0x20);
      do {
        QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                  ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,
                   (string_t)paVar1->pointer,aggr_input_data);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    if (local_68 == 0) {
      if (count != 0) {
        lVar3 = *local_78;
        uVar6 = 0;
        do {
          uVar8 = uVar6;
          if (lVar3 != 0) {
            uVar8 = (ulong)*(uint *)(lVar3 + uVar6 * 4);
          }
          element_02.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + uVar8 * 0x10);
          element_02.value._0_8_ = *(undefined8 *)(local_70 + uVar8 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,element_02
                     ,aggr_input_data);
          uVar6 = uVar6 + 1;
        } while (count != uVar6);
      }
    }
    else if (count != 0) {
      lVar3 = *local_78;
      uVar6 = 0;
      do {
        uVar8 = uVar6;
        if (lVar3 != 0) {
          uVar8 = (ulong)*(uint *)(lVar3 + uVar6 * 4);
        }
        if ((local_68 == 0) ||
           ((*(ulong *)(local_68 + (uVar8 >> 6) * 8) >> (uVar8 & 0x3f) & 1) != 0)) {
          element_01.value.pointer.ptr = (char *)*(undefined8 *)(local_70 + 8 + uVar8 * 0x10);
          element_01.value._0_8_ = *(undefined8 *)(local_70 + uVar8 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    ((QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)state,element_01
                     ,aggr_input_data);
        }
        uVar6 = uVar6 + 1;
      } while (count != uVar6);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}